

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_token.c
# Opt level: O3

gtoken_t token_special_builtin(gtoken_s *token)

{
  char *s1;
  int iVar1;
  gtoken_t gVar2;
  gbuiltin_t gVar3;
  
  gVar2 = TOK_IDENTIFIER;
  if (4 < token->bytes - 8) {
    return TOK_IDENTIFIER;
  }
  s1 = token->value;
  switch(token->bytes) {
  case 8:
    iVar1 = string_casencmp(s1,"__LINE__",8);
    if (iVar1 != 0) {
      iVar1 = string_casencmp(s1,"__FILE__",8);
      if (iVar1 != 0) {
        return TOK_IDENTIFIER;
      }
      gVar3 = BUILTIN_FILE;
      goto LAB_00114f6e;
    }
    gVar2 = TOK_NUMBER;
    gVar3 = BUILTIN_LINE;
    break;
  case 9:
    iVar1 = string_casencmp(s1,"__CLASS__",9);
    gVar3 = BUILTIN_CLASS;
    if (iVar1 != 0) {
      return TOK_IDENTIFIER;
    }
LAB_00114f6e:
    gVar2 = TOK_STRING;
    break;
  case 10:
    iVar1 = string_casencmp(s1,"__COLUMN__",10);
    if (iVar1 != 0) {
      return TOK_IDENTIFIER;
    }
    gVar2 = TOK_NUMBER;
    gVar3 = BUILTIN_COLUMN;
    break;
  case 0xb:
    goto switchD_00114eec_caseD_b;
  case 0xc:
    iVar1 = string_casencmp(s1,"__FUNCTION__",0xc);
    if (iVar1 != 0) {
      return TOK_IDENTIFIER;
    }
    gVar2 = TOK_STRING;
    gVar3 = BUILTIN_FUNC;
  }
  token->builtin = gVar3;
switchD_00114eec_caseD_b:
  return gVar2;
}

Assistant:

gtoken_t token_special_builtin(gtoken_s *token) {
    const char *buffer = token->value;
    int32_t len = token->bytes;

    switch (len) {
        case 8:
            if (string_casencmp(buffer, "__LINE__", len) == 0) {
                token->builtin = BUILTIN_LINE;
                return TOK_NUMBER;
            }
            if (string_casencmp(buffer, "__FILE__", len) == 0) {
                token->builtin = BUILTIN_FILE;
                return TOK_STRING;
            }
            break;

        case 9:
            if (string_casencmp(buffer, "__CLASS__", len) == 0) {
                token->builtin = BUILTIN_CLASS;
                return TOK_STRING;
            }
            break;

        case 10:
            if (string_casencmp(buffer, "__COLUMN__", len) == 0) {
                token->builtin = BUILTIN_COLUMN;
                return TOK_NUMBER;
            }
            break;

        case 12:
            if (string_casencmp(buffer, "__FUNCTION__", len) == 0) {
                token->builtin = BUILTIN_FUNC;
                return TOK_STRING;
            }
            break;
    }

    return TOK_IDENTIFIER;
}